

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O1

void __thiscall testing::internal::DeathTestImpl::Abort(DeathTestImpl *this,AbortReason reason)

{
  undefined8 *puVar1;
  ssize_t sVar2;
  int *piVar3;
  long *plVar4;
  undefined8 *puVar5;
  long *plVar6;
  ulong *puVar7;
  size_type *psVar8;
  ulong uVar9;
  undefined8 uVar10;
  char status_ch;
  char local_119;
  undefined8 *local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  ulong *local_f8;
  long local_f0;
  ulong local_e8;
  long lStack_e0;
  int local_d4;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  local_119 = 'L';
  if (reason != TEST_DID_NOT_DIE) {
    local_119 = (reason == TEST_THREW_EXCEPTION) * '\x02' + 'R';
  }
  do {
    sVar2 = write(this->write_fd_,&local_119,1);
    if ((int)sVar2 != -1) {
      _exit(1);
    }
    piVar3 = __errno_location();
  } while (*piVar3 == 4);
  local_30[0] = local_20;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_30,"CHECK failed: File ","");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_30);
  local_b0 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_b0 == plVar6) {
    local_a0 = *plVar6;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar6;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_b0);
  local_f8 = (ulong *)*plVar4;
  puVar7 = (ulong *)(plVar4 + 2);
  if (local_f8 == puVar7) {
    local_e8 = *puVar7;
    lStack_e0 = plVar4[3];
    local_f8 = &local_e8;
  }
  else {
    local_e8 = *puVar7;
  }
  local_f0 = plVar4[1];
  *plVar4 = (long)puVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  local_d4 = 0x206;
  StreamableToString<int>(&local_d0,&local_d4);
  uVar9 = 0xf;
  if (local_f8 != &local_e8) {
    uVar9 = local_e8;
  }
  if (uVar9 < local_d0._M_string_length + local_f0) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      uVar10 = local_d0.field_2._M_allocated_capacity;
    }
    if (local_d0._M_string_length + local_f0 <= (ulong)uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_d0,0,(char *)0x0,(ulong)local_f8);
      goto LAB_0011de3d;
    }
  }
  puVar5 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_d0._M_dataplus._M_p);
LAB_0011de3d:
  local_118 = (undefined8 *)*puVar5;
  puVar1 = puVar5 + 2;
  if (local_118 == puVar1) {
    local_108 = *puVar1;
    uStack_100 = puVar5[3];
    local_118 = &local_108;
  }
  else {
    local_108 = *puVar1;
  }
  local_110 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_118);
  local_90 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_90 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_70 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_70 == plVar6) {
    local_60 = *plVar6;
    lStack_58 = plVar4[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar6;
  }
  local_68 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_50._M_dataplus._M_p = (pointer)*plVar4;
  psVar8 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_50._M_dataplus._M_p == psVar8) {
    local_50.field_2._M_allocated_capacity = *psVar8;
    local_50.field_2._8_8_ = plVar4[3];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = *psVar8;
  }
  local_50._M_string_length = plVar4[1];
  *plVar4 = (long)psVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  DeathTestAbort(&local_50);
}

Assistant:

void DeathTestImpl::Abort(AbortReason reason) {
  // The parent process considers the death test to be a failure if
  // it finds any data in our pipe.  So, here we write a single flag byte
  // to the pipe, then exit.
  const char status_ch =
      reason == TEST_DID_NOT_DIE ? kDeathTestLived :
      reason == TEST_THREW_EXCEPTION ? kDeathTestThrew : kDeathTestReturned;

  GTEST_DEATH_TEST_CHECK_SYSCALL_(posix::Write(write_fd(), &status_ch, 1));
  // We are leaking the descriptor here because on some platforms (i.e.,
  // when built as Windows DLL), destructors of global objects will still
  // run after calling _exit(). On such systems, write_fd_ will be
  // indirectly closed from the destructor of UnitTestImpl, causing double
  // close if it is also closed here. On debug configurations, double close
  // may assert. As there are no in-process buffers to flush here, we are
  // relying on the OS to close the descriptor after the process terminates
  // when the destructors are not run.
  _exit(1);  // Exits w/o any normal exit hooks (we were supposed to crash)
}